

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RCX;
  code *in_RDX;
  int *in_RSI;
  int in_R8D;
  int in_R9D;
  byte bVar3;
  float _y;
  char *item_text;
  bool item_selected;
  int i;
  bool value_changed;
  char *preview_value;
  ImGuiContext *g;
  ImGuiComboFlags in_stack_0000013c;
  char *in_stack_00000140;
  char *in_stack_00000148;
  void *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 local_40;
  ImGuiContext *local_38;
  int local_30;
  int local_2c;
  undefined8 local_28;
  code *local_20;
  int *local_18;
  bool local_1;
  
  local_38 = GImGui;
  local_40 = 0;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((-1 < *in_RSI) && (*in_RSI < in_R8D)) {
    (*in_RDX)(in_RCX,*in_RSI,&local_40);
  }
  if ((local_30 != -1) && (((local_38->NextWindowData).Flags & 0x10U) == 0)) {
    ImVec2::ImVec2(&local_48,0.0,0.0);
    _y = CalcMaxPopupHeightFromItemCount(local_30);
    ImVec2::ImVec2(&local_50,3.4028235e+38,_y);
    SetNextWindowSizeConstraints
              ((ImVec2 *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(ImGuiSizeCallback)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
  }
  bVar1 = BeginCombo(in_stack_00000148,in_stack_00000140,in_stack_0000013c);
  if (bVar1) {
    bVar1 = false;
    for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
      PushID((void *)in_stack_ffffffffffffff90);
      bVar3 = local_58 == *local_18;
      (*local_20)(local_28,local_58,&stack0xffffffffffffff98);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,0.0,0.0);
      bVar2 = Selectable((char *)CONCAT44(items_count,popup_max_height_in_items),g._7_1_,
                         (ImGuiSelectableFlags)g,(ImVec2 *)preview_value);
      if (bVar2) {
        bVar1 = true;
        *local_18 = local_58;
      }
      if ((bVar3 & 1) != 0) {
        SetItemDefaultFocus();
      }
      PopID();
    }
    EndCombo();
    local_1 = bVar1;
    if (bVar1 != false) {
      MarkItemEdited((local_38->CurrentWindow->DC).LastItemId);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0, 0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}